

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

uint64 mkvmuxer::EbmlElementSize(uint64 type,char *value)

{
  size_t sVar1;
  long lVar2;
  uint64 uVar3;
  long lVar4;
  
  if (value == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    lVar4 = 1;
    lVar2 = 1;
    if ((((0xff < type) && (lVar2 = 2, 0xffff < type)) && (lVar2 = 3, 0xffffff < type)) &&
       (((lVar2 = 4, type >> 0x20 != 0 && (lVar2 = 5, type >> 0x28 != 0)) &&
        (lVar2 = 6, type >> 0x30 != 0)))) {
      lVar2 = 8 - (ulong)(type >> 0x38 == 0);
    }
    sVar1 = strlen(value);
    if (((0x7e < sVar1) && (lVar4 = 2, 0x3ffe < sVar1)) &&
       ((lVar4 = 3, 0x1ffffe < sVar1 &&
        (((lVar4 = 4, 0xffffffe < sVar1 && (lVar4 = 5, 0x7fffffffe < sVar1)) &&
         (lVar4 = 6, 0x3fffffffffe < sVar1)))))) {
      lVar4 = 8 - (ulong)(sVar1 < 0x1ffffffffffff);
    }
    uVar3 = lVar2 + sVar1 + lVar4;
  }
  return uVar3;
}

Assistant:

uint64 EbmlElementSize(uint64 type, const char* value) {
  if (!value)
    return 0;

  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += strlen(value);

  // Size of Datasize
  ebml_size += GetCodedUIntSize(strlen(value));

  return ebml_size;
}